

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlat<unsigned_short,unsigned_short,unsigned_short,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseXOROperator,bool,false,false>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  unsigned_short *ldata;
  unsigned_short *rdata;
  unsigned_short *result_data;
  
  ldata = *(unsigned_short **)(left + 0x20);
  rdata = *(unsigned_short **)(right + 0x20);
  duckdb::Vector::SetVectorType((VectorType)result);
  result_data = *(unsigned_short **)(result + 0x20);
  FlatVector::VerifyFlatVector(result);
  FlatVector::VerifyFlatVector(left);
  FlatVector::VerifyFlatVector(result);
  *(undefined8 *)(result + 0x28) = *(undefined8 *)(left + 0x28);
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30),
             (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(left + 0x30));
  *(undefined8 *)(result + 0x40) = *(undefined8 *)(left + 0x40);
  FlatVector::VerifyFlatVector(right);
  duckdb::ValidityMask::Combine((ValidityMask *)(result + 0x28),(ulong)(right + 0x28));
  ExecuteFlatLoop<unsigned_short,unsigned_short,unsigned_short,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseXOROperator,bool,false,false>
            (ldata,rdata,result_data,count,(ValidityMask *)(result + 0x28),fun);
  return;
}

Assistant:

static void ExecuteFlat(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		auto ldata = FlatVector::GetData<LEFT_TYPE>(left);
		auto rdata = FlatVector::GetData<RIGHT_TYPE>(right);

		if ((LEFT_CONSTANT && ConstantVector::IsNull(left)) || (RIGHT_CONSTANT && ConstantVector::IsNull(right))) {
			// either left or right is constant NULL: result is constant NULL
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
			return;
		}

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		auto &result_validity = FlatVector::Validity(result);
		if (LEFT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(right), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(right));
			}
		} else if (RIGHT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
			}
		} else {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
				if (result_validity.AllValid()) {
					result_validity.Copy(FlatVector::Validity(right), count);
				} else {
					result_validity.Combine(FlatVector::Validity(right), count);
				}
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
				result_validity.Combine(FlatVector::Validity(right), count);
			}
		}
		ExecuteFlatLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC, LEFT_CONSTANT, RIGHT_CONSTANT>(
		    ldata, rdata, result_data, count, result_validity, fun);
	}